

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
lsim::ModelCircuit::component_ids_of_type
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ModelCircuit *this,ComponentType type)

{
  bool bVar1;
  ComponentType CVar2;
  pointer pMVar3;
  iterator __first;
  iterator __last;
  uint32_t local_68 [4];
  reference local_58;
  value_type *comp;
  const_iterator __end1;
  const_iterator __begin1;
  component_lut_t *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  ComponentType type_local;
  ModelCircuit *this_local;
  
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = type;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  __end1 = std::
           unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
           ::begin(&this->m_components);
  comp = (value_type *)
         std::
         unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
         ::end(&this->m_components);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                         *)&comp);
    if (!bVar1) break;
    local_58 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false,_false>
               ::operator*(&__end1);
    pMVar3 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
             operator->(&local_58->second);
    CVar2 = ModelComponent::type(pMVar3);
    if (CVar2 == result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_) {
      pMVar3 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::
               operator->(&local_58->second);
      local_68[0] = ModelComponent::id(pMVar3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,local_68);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ModelCircuit::component_ids_of_type(ComponentType type) const {
    std::vector<uint32_t> result;

    for (const auto &comp : m_components) {
        if (comp.second->type() == type) {
            result.push_back(comp.second->id());
        }
    }

    std::sort(result.begin(), result.end());
    return std::move(result);
}